

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemarena.h
# Opt level: O0

bool __thiscall cookmem::FixedArena::freeSegment(FixedArena *this,void *ptr,size_t size)

{
  size_t size_local;
  void *ptr_local;
  FixedArena *this_local;
  
  if ((((this->m_used & 1U) == 0) || (ptr != this->m_page)) || (size != this->m_size)) {
    this_local._7_1_ = true;
  }
  else {
    this->m_used = false;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
    freeSegment (void* ptr, std::size_t size)
    {
        if (!m_used || ptr != m_page || size != m_size)
        {
            return true;
        }
        m_used = false;
        return false;
    }